

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLDefectsTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test::
TestBody(OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test *this)

{
  size_t len;
  char *in_R9;
  AssertHelper local_230;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  string local_220;
  AssertionResult gtest_ar_;
  OpenDDLParser myParser;
  char token [380];
  
  memcpy(token,
         "Material $material1\n{\n    Name { string { \"defaultMat\" } }\n\n    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n    Param( attrib = \"specular_power\" ) { float { 50 } }\n\n    Texture( attrib = \"diffuse\" )\n    {\n        string { \"//f/kittylow.bmp\" }\n    }\n}\n"
         ,0x17c);
  OpenDDLParser::OpenDDLParser(&myParser);
  len = strlen(token);
  OpenDDLParser::setBuffer(&myParser,token,len);
  gtest_ar_.success_ = OpenDDLParser::parse(&myParser);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_220,(internal *)&gtest_ar_,(AssertionResult *)"ok","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLDefectsTest.cpp"
               ,0x81,local_220._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_220);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_228);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  OpenDDLParser::~OpenDDLParser(&myParser);
  return;
}

Assistant:

TEST_F( OpenDDLDefectsTest, strings_with_the_comment_syntax_in_them_breaks_the_parser ) {
    char token[] = {
        "Material $material1\n"
        "{\n"
        "    Name { string { \"defaultMat\" } }\n"
        "\n"
        "    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n"
        "    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n"
        "    Param( attrib = \"specular_power\" ) { float { 50 } }\n"
        "\n"
        "    Texture( attrib = \"diffuse\" )\n"
        "    {\n"
        "        string { \"//f/kittylow.bmp\" }\n"
        "    }\n"
        "}\n"
    };

    OpenDDLParser myParser;
    myParser.setBuffer( token, strlen( token ) );
    const bool ok( myParser.parse() );
    EXPECT_TRUE( ok );

}